

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int ipairsaux(lua_State *L)

{
  StkId pTVar1;
  lua_Integer lVar2;
  int iVar3;
  int n;
  
  iVar3 = 2;
  lVar2 = luaL_checkinteger(L,2);
  luaL_checktype(L,1,5);
  n = (int)lVar2 + 1;
  pTVar1 = L->top;
  (pTVar1->value).n = (double)n;
  pTVar1->tt = 3;
  L->top = L->top + 1;
  lua_rawgeti(L,1,n);
  if ((Node *)L->top != &dummynode_) {
    iVar3 = (uint)(*(int *)((long)&((Node *)L->top)[-1].i_key + 0x10) != 0) * 2;
  }
  return iVar3;
}

Assistant:

static int ipairsaux(lua_State*L){
int i=luaL_checkint(L,2);
luaL_checktype(L,1,5);
i++;
lua_pushinteger(L,i);
lua_rawgeti(L,1,i);
return(lua_isnil(L,-1))?0:2;
}